

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CanSimulationDataGenerator.cpp
# Opt level: O2

void __thiscall CanSimulationDataGenerator::AddCrc(CanSimulationDataGenerator *this)

{
  vector<BitState,_std::allocator<BitState>_> *this_00;
  U16 UVar1;
  BitState *__args;
  int iVar2;
  uint uVar3;
  bool bVar4;
  BitState local_48;
  BitState local_44;
  vector<BitState,std::allocator<BitState>> *local_40;
  BitState local_34;
  
  this_00 = &this->mFakeStuffedBits;
  std::vector<BitState,std::allocator<BitState>>::
  insert<__gnu_cxx::__normal_iterator<BitState*,std::vector<BitState,std::allocator<BitState>>>,void>
            ((vector<BitState,std::allocator<BitState>> *)this_00,
             (const_iterator)
             (this->mFakeStuffedBits).super__Vector_base<BitState,_std::allocator<BitState>_>.
             _M_impl.super__Vector_impl_data._M_finish,
             (__normal_iterator<BitState_*,_std::vector<BitState,_std::allocator<BitState>_>_>)
             (this->mFakeStartOfFrameField).super__Vector_base<BitState,_std::allocator<BitState>_>.
             _M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<BitState_*,_std::vector<BitState,_std::allocator<BitState>_>_>)
             (this->mFakeStartOfFrameField).super__Vector_base<BitState,_std::allocator<BitState>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  std::vector<BitState,std::allocator<BitState>>::
  insert<__gnu_cxx::__normal_iterator<BitState*,std::vector<BitState,std::allocator<BitState>>>,void>
            ((vector<BitState,std::allocator<BitState>> *)this_00,
             (const_iterator)
             (this->mFakeStuffedBits).super__Vector_base<BitState,_std::allocator<BitState>_>.
             _M_impl.super__Vector_impl_data._M_finish,
             (__normal_iterator<BitState_*,_std::vector<BitState,_std::allocator<BitState>_>_>)
             (this->mFakeArbitrationField).super__Vector_base<BitState,_std::allocator<BitState>_>.
             _M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<BitState_*,_std::vector<BitState,_std::allocator<BitState>_>_>)
             (this->mFakeArbitrationField).super__Vector_base<BitState,_std::allocator<BitState>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  std::vector<BitState,std::allocator<BitState>>::
  insert<__gnu_cxx::__normal_iterator<BitState*,std::vector<BitState,std::allocator<BitState>>>,void>
            ((vector<BitState,std::allocator<BitState>> *)this_00,
             (const_iterator)
             (this->mFakeStuffedBits).super__Vector_base<BitState,_std::allocator<BitState>_>.
             _M_impl.super__Vector_impl_data._M_finish,
             (__normal_iterator<BitState_*,_std::vector<BitState,_std::allocator<BitState>_>_>)
             (this->mFakeControlField).super__Vector_base<BitState,_std::allocator<BitState>_>.
             _M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<BitState_*,_std::vector<BitState,_std::allocator<BitState>_>_>)
             (this->mFakeControlField).super__Vector_base<BitState,_std::allocator<BitState>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  std::vector<BitState,std::allocator<BitState>>::
  insert<__gnu_cxx::__normal_iterator<BitState*,std::vector<BitState,std::allocator<BitState>>>,void>
            ((vector<BitState,std::allocator<BitState>> *)this_00,
             (const_iterator)
             (this->mFakeStuffedBits).super__Vector_base<BitState,_std::allocator<BitState>_>.
             _M_impl.super__Vector_impl_data._M_finish,
             (__normal_iterator<BitState_*,_std::vector<BitState,_std::allocator<BitState>_>_>)
             (this->mFakeDataField).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<BitState_*,_std::vector<BitState,_std::allocator<BitState>_>_>)
             (this->mFakeDataField).super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
             super__Vector_impl_data._M_finish);
  local_40 = (vector<BitState,std::allocator<BitState>> *)this_00;
  UVar1 = ComputeCrc(this,this_00,
                     (U32)((ulong)((long)(this->mFakeStuffedBits).
                                         super__Vector_base<BitState,_std::allocator<BitState>_>.
                                         _M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->mFakeStuffedBits).
                                        super__Vector_base<BitState,_std::allocator<BitState>_>.
                                        _M_impl.super__Vector_impl_data._M_start) >> 2));
  uVar3 = 0x4000;
  iVar2 = 0xf;
  while (bVar4 = iVar2 != 0, iVar2 = iVar2 + -1, bVar4) {
    if ((uVar3 & UVar1) == 0) {
      local_44 = CanAnalyzerSettings::Dominant(this->mSettings);
      __args = &local_44;
    }
    else {
      local_48 = CanAnalyzerSettings::Recessive(this->mSettings);
      __args = &local_48;
    }
    std::vector<BitState,_std::allocator<BitState>_>::emplace_back<BitState>
              (&this->mFakeCrcFieldWithoutDelimiter,__args);
    uVar3 = uVar3 >> 1;
  }
  std::vector<BitState,std::allocator<BitState>>::
  insert<__gnu_cxx::__normal_iterator<BitState*,std::vector<BitState,std::allocator<BitState>>>,void>
            (local_40,(const_iterator)
                      (this->mFakeStuffedBits).
                      super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.
                      super__Vector_impl_data._M_finish,
             (__normal_iterator<BitState_*,_std::vector<BitState,_std::allocator<BitState>_>_>)
             (this->mFakeCrcFieldWithoutDelimiter).
             super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.super__Vector_impl_data
             ._M_start,
             (__normal_iterator<BitState_*,_std::vector<BitState,_std::allocator<BitState>_>_>)
             (this->mFakeCrcFieldWithoutDelimiter).
             super__Vector_base<BitState,_std::allocator<BitState>_>._M_impl.super__Vector_impl_data
             ._M_finish);
  local_34 = CanAnalyzerSettings::Recessive(this->mSettings);
  std::vector<BitState,_std::allocator<BitState>_>::emplace_back<BitState>
            (&this->mFakeFixedFormBits,&local_34);
  return;
}

Assistant:

void CanSimulationDataGenerator::AddCrc()
{
    mFakeStuffedBits.insert( mFakeStuffedBits.end(), mFakeStartOfFrameField.begin(), mFakeStartOfFrameField.end() );
    mFakeStuffedBits.insert( mFakeStuffedBits.end(), mFakeArbitrationField.begin(), mFakeArbitrationField.end() );
    mFakeStuffedBits.insert( mFakeStuffedBits.end(), mFakeControlField.begin(), mFakeControlField.end() );
    mFakeStuffedBits.insert( mFakeStuffedBits.end(), mFakeDataField.begin(), mFakeDataField.end() );

    U32 bits_for_crc = mFakeStuffedBits.size();
    U16 crc = ComputeCrc( mFakeStuffedBits, bits_for_crc );
    U32 mask = 0x4000;
    for( U32 i = 0; i < 15; i++ )
    {
        if( ( mask & crc ) == 0 )
            mFakeCrcFieldWithoutDelimiter.push_back( mSettings->Dominant() );
        else
            mFakeCrcFieldWithoutDelimiter.push_back( mSettings->Recessive() );

        mask >>= 1;
    }

    mFakeStuffedBits.insert( mFakeStuffedBits.end(), mFakeCrcFieldWithoutDelimiter.begin(), mFakeCrcFieldWithoutDelimiter.end() );

    // CRC DELIMITER (Standard Format as well as Extended Format)
    // The CRC SEQUENCE is followed by the CRC DELIMITER which consists of a single
    // recessive bit.

    mFakeFixedFormBits.push_back( mSettings->Recessive() );
}